

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_sort_tree.hpp
# Opt level: O2

RunElement __thiscall
duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>::
StartGames(MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL> *this,
          Games *losers,RunElements *elements,RunElement *sentinel)

{
  ulong uVar1;
  unsigned_long uVar2;
  long lVar3;
  pair<unsigned_long,_unsigned_long> *ppVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  pair<unsigned_long,_unsigned_long> *ppVar10;
  idx_t i;
  long lVar11;
  Games winners;
  undefined1 auStack_220 [8];
  undefined1 auStack_218 [8];
  unsigned_long uStack_210;
  RunElement local_208 [15];
  unsigned_long auStack_118 [23];
  ulong auStack_60 [9];
  
  lVar11 = 0;
  uStack_210 = 0x1ac0df0;
  switchD_014c3389::default(local_208,0,0x1f0);
  lVar3 = 0xf8;
  ppVar4 = elements->_M_elems;
  for (; lVar3 != 0x1f8; lVar3 = lVar3 + 0x10) {
    uVar9 = ((pair<unsigned_long,_unsigned_long> *)&ppVar4->first)->first;
    uVar6 = ppVar4[1].first;
    ppVar10 = ppVar4;
    if (uVar9 < uVar6) {
      uVar8 = ppVar4[1].second;
    }
    else if ((uVar6 < uVar9) || (uVar8 = ppVar4[1].second, ppVar4[1].second <= ppVar4->second)) {
      uVar6 = uVar9;
      uVar8 = ppVar4->second;
      ppVar10 = elements->_M_elems + lVar11 * 2 + 1;
    }
    *(ulong *)((long)losers->_M_elems + lVar3 + -8) = uVar6;
    *(ulong *)((long)&losers->_M_elems[0].first + lVar3) = uVar8;
    uVar2 = ppVar10->second;
    *(unsigned_long *)((long)&uStack_210 + lVar3) =
         ((pair<unsigned_long,_unsigned_long> *)&ppVar10->first)->first;
    *(unsigned_long *)((long)&local_208[0].first + lVar3) = uVar2;
    lVar11 = lVar11 + 1;
    ppVar4 = ppVar4 + 2;
  }
  for (lVar3 = 0xf4; lVar3 != 4; lVar3 = lVar3 + -0x10) {
    uVar9 = *(ulong *)(auStack_220 + lVar3 * 2);
    uVar6 = *(ulong *)((long)&uStack_210 + lVar3 * 2);
    if (uVar9 < uVar6) {
      uVar5 = uVar9;
      uVar7 = *(ulong *)(auStack_218 + lVar3 * 2);
      uVar9 = uVar6;
      uVar8 = *(ulong *)((long)&local_208[0].first + lVar3 * 2);
    }
    else {
      uVar8 = *(ulong *)(auStack_218 + lVar3 * 2);
      uVar1 = *(ulong *)((long)&local_208[0].first + lVar3 * 2);
      uVar5 = uVar6;
      uVar7 = uVar1;
      if (uVar9 <= uVar6 && uVar8 < uVar1) {
        uVar5 = uVar9;
        uVar7 = uVar8;
        uVar9 = uVar6;
        uVar8 = uVar1;
      }
    }
    *(ulong *)((long)losers->_M_elems + lVar3 + -0x14) = uVar9;
    *(ulong *)((long)losers->_M_elems + lVar3 + -0xc) = uVar8;
    *(ulong *)(auStack_220 + lVar3 + 4) = uVar5;
    *(ulong *)(auStack_218 + lVar3 + 4) = uVar7;
  }
  return local_208[0];
}

Assistant:

RunElement StartGames(Games &losers, const RunElements &elements, const RunElement &sentinel) {
		const auto elem_nodes = elements.size();
		const auto game_nodes = losers.size();
		Games winners;

		//	Play the first round of games,
		//	placing the losers at the bottom of the game
		const auto base_offset = game_nodes / 2;
		auto losers_base = losers.data() + base_offset;
		auto winners_base = winners.data() + base_offset;

		const auto base_count = elem_nodes / 2;
		for (idx_t i = 0; i < base_count; ++i) {
			const auto &e0 = elements[i * 2 + 0];
			const auto &e1 = elements[i * 2 + 1];
			if (cmp(e0, e1)) {
				losers_base[i] = e1;
				winners_base[i] = e0;
			} else {
				losers_base[i] = e0;
				winners_base[i] = e1;
			}
		}

		//	Fill in any byes
		if (elem_nodes % 2) {
			winners_base[base_count] = elements.back();
			losers_base[base_count] = sentinel;
		}

		//	Pad to a power of 2
		const auto base_size = (game_nodes + 1) / 2;
		for (idx_t i = (elem_nodes + 1) / 2; i < base_size; ++i) {
			winners_base[i] = sentinel;
			losers_base[i] = sentinel;
		}

		//	Play the winners against each other
		//	and stick the losers in the upper levels of the tournament tree
		for (idx_t i = base_offset; i-- > 0;) {
			//	Indexing backwards
			const auto &e0 = winners[i * 2 + 1];
			const auto &e1 = winners[i * 2 + 2];
			if (cmp(e0, e1)) {
				losers[i] = e1;
				winners[i] = e0;
			} else {
				losers[i] = e0;
				winners[i] = e1;
			}
		}

		//	Return the final winner
		return winners[0];
	}